

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cpp
# Opt level: O3

Sexp * AnalyzeShortCircuit(Sexp *form)

{
  pointer ppSVar1;
  Meaning *pMVar2;
  Sexp *pSVar3;
  undefined8 *puVar4;
  Kind KVar5;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  vector<Sexp_*,_std::allocator<Sexp_*>_> local_b8;
  vector<Sexp_*,_std::allocator<Sexp_*>_> local_98;
  undefined1 auStack_78 [8];
  vector<Sexp_*,_std::allocator<Sexp_*>_> args;
  uint *local_58;
  undefined8 local_50;
  uint local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  Sexp *local_38;
  Sexp *form_local;
  ContractFrameProtector __contract_frame;
  FrameProtector __frame_prot;
  
  local_38 = form;
  ContractFrameProtector::ContractFrameProtector
            ((ContractFrameProtector *)&form_local,"AnalyzeShortCircuit");
  ContractFrame::CheckPrecondition((ContractFrame *)form_local,form->kind == CONS,"form->IsCons()");
  if (form->kind == CONS) {
    ContractFrame::CheckPrecondition
              ((ContractFrame *)form_local,((form->field_1).cons.car)->kind == SYMBOL,
               "form->Car()->IsSymbol()");
    if (local_38->kind == CONS) {
      ContractFrame::CheckPrecondition
                ((ContractFrame *)form_local,
                 (((local_38->field_1).function.func_meaning)->arity & 0xfffffffffffffffe) == 0xc,
                 "form->Car()->symbol_value == SymbolInterner::And || form->Car()->symbol_value == SymbolInterner::Or"
                );
      FrameProtector::FrameProtector((FrameProtector *)&__contract_frame,"AnalyzeShortCircuit");
      FrameProtector::ProtectValue((FrameProtector *)&__contract_frame,&local_38,"form");
      auStack_78 = (undefined1  [8])0x0;
      args.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      args.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      FrameProtector::ProtectVector
                ((FrameProtector *)&__contract_frame,
                 (vector<Sexp_*,_std::allocator<Sexp_*>_> *)auStack_78,"args");
      if (local_38->kind == CONS) {
        KVar5 = CONS;
        pSVar3 = local_38;
        while (KVar5 == CONS) {
          pSVar3 = (pSVar3->field_1).cons.cdr;
          KVar5 = pSVar3->kind;
        }
        if (KVar5 == EMPTY) {
          local_d8._8_8_ = 0;
          local_c0 = std::
                     _Function_handler<void_(Sexp_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/analysis.cpp:623:7)>
                     ::_M_invoke;
          local_c8 = std::
                     _Function_handler<void_(Sexp_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/analysis.cpp:623:7)>
                     ::_M_manager;
          local_d8._M_unused._M_object = (vector<Sexp_*,_std::allocator<Sexp_*>_> *)auStack_78;
          Sexp::ForEach((local_38->field_1).cons.cdr,(function<void_(Sexp_*)> *)&local_d8);
          if (local_c8 != (code *)0x0) {
            (*local_c8)(&local_d8,&local_d8,__destroy_functor);
          }
          if (local_38->kind == CONS) {
            ppSVar1 = (((local_38->field_1).activation)->slots).
                      super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (ppSVar1 == (pointer)0xd) {
              pMVar2 = (Meaning *)operator_new(0x20);
              std::vector<Sexp_*,_std::allocator<Sexp_*>_>::vector
                        (&local_98,(vector<Sexp_*,_std::allocator<Sexp_*>_> *)auStack_78);
              pMVar2->_vptr_Meaning = (_func_int **)&PTR_Eval_00125c10;
              pMVar2[1]._vptr_Meaning =
                   (_func_int **)
                   local_98.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
              pMVar2[2]._vptr_Meaning =
                   (_func_int **)
                   local_98.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              pMVar2[3]._vptr_Meaning =
                   (_func_int **)
                   local_98.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              local_98.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_98.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_98.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              FrameProtector::ProtectVector
                        ((FrameProtector *)&__contract_frame,
                         (vector<Sexp_*,_std::allocator<Sexp_*>_> *)(pMVar2 + 1),
                         "meaning->Arguments()");
              pSVar3 = GcHeap::AllocateMeaning(pMVar2);
            }
            else {
              if (ppSVar1 != (pointer)0xc) {
                __assert_fail("form->Car()->symbol_value == SymbolInterner::Or",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/analysis.cpp"
                              ,0x276,"Sexp *AnalyzeShortCircuit(Sexp *)");
              }
              pMVar2 = (Meaning *)operator_new(0x20);
              std::vector<Sexp_*,_std::allocator<Sexp_*>_>::vector
                        (&local_b8,(vector<Sexp_*,_std::allocator<Sexp_*>_> *)auStack_78);
              pMVar2->_vptr_Meaning = (_func_int **)&PTR_Eval_00125bc0;
              pMVar2[1]._vptr_Meaning =
                   (_func_int **)
                   local_b8.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
              pMVar2[2]._vptr_Meaning =
                   (_func_int **)
                   local_b8.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              pMVar2[3]._vptr_Meaning =
                   (_func_int **)
                   local_b8.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              local_b8.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_b8.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_b8.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              FrameProtector::ProtectVector
                        ((FrameProtector *)&__contract_frame,
                         (vector<Sexp_*,_std::allocator<Sexp_*>_> *)(pMVar2 + 1),
                         "meaning->Arguments()");
              pSVar3 = GcHeap::AllocateMeaning(pMVar2);
            }
            if (auStack_78 != (undefined1  [8])0x0) {
              operator_delete((void *)auStack_78,
                              (long)args.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl
                                    .super__Vector_impl_data._M_finish - (long)auStack_78);
            }
            FrameProtector::~FrameProtector((FrameProtector *)&__contract_frame);
            ContractFrameProtector::~ContractFrameProtector((ContractFrameProtector *)&form_local);
            return pSVar3;
          }
          goto LAB_0011527c;
        }
      }
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_58 = &local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"invalid short-circuiting form","");
      *puVar4 = &PTR__JetRuntimeException_00125918;
      puVar4[1] = puVar4 + 3;
      if (local_58 == &local_48) {
        *(uint *)(puVar4 + 3) = local_48;
        *(undefined4 *)((long)puVar4 + 0x1c) = uStack_44;
        *(undefined4 *)(puVar4 + 4) = uStack_40;
        *(undefined4 *)((long)puVar4 + 0x24) = uStack_3c;
      }
      else {
        puVar4[1] = local_58;
        puVar4[3] = CONCAT44(uStack_44,local_48);
      }
      puVar4[2] = local_50;
      local_50 = 0;
      local_48 = local_48 & 0xffffff00;
      local_58 = &local_48;
      __cxa_throw(puVar4,&JetRuntimeException::typeinfo,JetRuntimeException::~JetRuntimeException);
    }
  }
LAB_0011527c:
  __assert_fail("IsCons()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/sexp.h"
                ,200,"Sexp *Sexp::Car() const");
}

Assistant:

Sexp *AnalyzeShortCircuit(Sexp *form) {
  CONTRACT {
    PRECONDITION(form->IsCons());
    PRECONDITION(form->Car()->IsSymbol());
    PRECONDITION(form->Car()->symbol_value == SymbolInterner::And ||
                 form->Car()->symbol_value == SymbolInterner::Or);
  }